

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

UnicodeString *
icu_63::RBBIRuleScanner::stripRules(UnicodeString *__return_storage_ptr__,UnicodeString *rules)

{
  short sVar1;
  UBool UVar2;
  UChar32 c;
  int32_t offset;
  int iVar3;
  bool bVar4;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003edbf0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  sVar1 = (rules->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (rules->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  bVar4 = false;
  for (offset = 0; offset < iVar3; offset = UnicodeString::moveIndex32(rules,offset,1)) {
    c = UnicodeString::char32At(rules,offset);
    UVar2 = u_hasBinaryProperty_63(c,UCHAR_PATTERN_WHITE_SPACE);
    bVar4 = (bool)(bVar4 & UVar2 != '\0');
    if (!bVar4) {
      UnicodeString::append(__return_storage_ptr__,c);
    }
    bVar4 = bVar4 || UVar2 != '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RBBIRuleScanner::stripRules(const UnicodeString &rules) {
    UnicodeString strippedRules;
    int32_t rulesLength = rules.length();
    bool skippingSpaces = false;

    for (int32_t idx=0; idx<rulesLength; idx = rules.moveIndex32(idx, 1)) {
        UChar32 cp = rules.char32At(idx);
        bool whiteSpace = u_hasBinaryProperty(cp, UCHAR_PATTERN_WHITE_SPACE);
        if (skippingSpaces && whiteSpace) {
            continue;
        }
        strippedRules.append(cp);
        skippingSpaces = whiteSpace;
    }
    return strippedRules;
}